

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_soa.h
# Opt level: O0

void __thiscall
pbrt::SOA<pbrt::TabulatedBSSRDF>::GetSetIndirector::operator=
          (GetSetIndirector *this,TabulatedBSSRDF *a)

{
  Float *pFVar1;
  float fVar2;
  Point3f *a_00;
  Normal3f *a_01;
  Point3f *in_RSI;
  GetSetIndirector *in_RDI;
  GetSetIndirector GVar3;
  GetSetIndirector GVar4;
  GetSetIndirector GVar5;
  float *s;
  GetSetIndirector local_40;
  GetSetIndirector local_30;
  GetSetIndirector local_20;
  Point3f *local_10;
  
  local_10 = in_RSI;
  GVar3 = SOA<pbrt::Point3<float>_>::operator[]
                    ((SOA<pbrt::Point3<float>_> *)&in_RDI->soa->ptr4,in_RDI->index);
  local_20.soa = GVar3.soa;
  local_20.i = GVar3.i;
  SOA<pbrt::Point3<float>_>::GetSetIndirector::operator=(&local_20,in_RSI);
  a_00 = local_10 + 1;
  GVar4 = SOA<pbrt::Vector3<float>_>::operator[]
                    ((SOA<pbrt::Vector3<float>_> *)&in_RDI->soa[1].ptr1,in_RDI->index);
  local_30.soa = GVar4.soa;
  local_30.i = GVar4.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_30,(Vector3f *)a_00);
  a_01 = (Normal3f *)(local_10 + 2);
  GVar5 = SOA<pbrt::Normal3<float>_>::operator[]
                    ((SOA<pbrt::Normal3<float>_> *)(in_RDI->soa + 3),in_RDI->index);
  local_40.soa = GVar5.soa;
  local_40.i = GVar5.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_40,a_01);
  (in_RDI->soa[4].ptr4)->v[in_RDI->index] = local_10[3].super_Tuple3<pbrt::Point3,_float>.x;
  fVar2 = local_10[6].super_Tuple3<pbrt::Point3,_float>.y;
  pFVar1 = in_RDI->soa[4].ptr1 + (long)in_RDI->index * 2;
  pFVar1[0] = local_10[6].super_Tuple3<pbrt::Point3,_float>.x;
  pFVar1[1] = fVar2;
  s = &local_10[3].super_Tuple3<pbrt::Point3,_float>.y;
  SOA<pbrt::SampledSpectrum>::operator[](in_RDI->soa + 5,in_RDI->index);
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=(in_RDI,(SampledSpectrum *)s);
  SOA<pbrt::SampledSpectrum>::operator[](in_RDI->soa + 6,in_RDI->index);
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=(in_RDI,(SampledSpectrum *)s);
  return;
}

Assistant:

PBRT_CPU_GPU
        void operator=(const TabulatedBSSRDF &a) {
            soa->po[i] = a.po;
            soa->wo[i] = a.wo;
            soa->ns[i] = a.ns;
            soa->eta[i] = a.eta;
            soa->table[i] = a.table;
            soa->sigma_t[i] = a.sigma_t;
            soa->rho[i] = a.rho;
        }